

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall
Am_Slot_Key_Type_Support_Class::~Am_Slot_Key_Type_Support_Class
          (Am_Slot_Key_Type_Support_Class *this)

{
  operator_delete(this);
  return;
}

Assistant:

void Print(std::ostream &os, const Am_Value &value) const override
  {
    Am_Slot_Key key = (Am_Slot_Key)value.value.long_value;
    const char *name = Am_Get_Slot_Name(key);
    if (name)
      os << name;
    else
      os << "[" << (int)key << "]";
  }